

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMousePosValid(ImVec2 *mouse_pos)

{
  bool local_29;
  ImVec2 *local_28;
  float local_1c;
  float fStack_18;
  ImVec2 p;
  float MOUSE_INVALID;
  ImVec2 *mouse_pos_local;
  
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                  ,0x11c8,"bool ImGui::IsMousePosValid(const ImVec2 *)");
  }
  local_28 = mouse_pos;
  if (mouse_pos == (ImVec2 *)0x0) {
    local_28 = &(GImGui->IO).MousePos;
  }
  local_1c = (*local_28).x;
  local_29 = false;
  if (-256000.0 <= local_1c) {
    fStack_18 = (*local_28).y;
    local_29 = -256000.0 <= fStack_18;
  }
  return local_29;
}

Assistant:

bool ImGui::IsMousePosValid(const ImVec2* mouse_pos)
{
    // The assert is only to silence a false-positive in XCode Static Analysis.
    // Because GImGui is not dereferenced in every code path, the static analyzer assume that it may be NULL (which it doesn't for other functions).
    IM_ASSERT(GImGui != NULL);
    const float MOUSE_INVALID = -256000.0f;
    ImVec2 p = mouse_pos ? *mouse_pos : GImGui->IO.MousePos;
    return p.x >= MOUSE_INVALID && p.y >= MOUSE_INVALID;
}